

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  byte bVar1;
  SessionHandle *pSVar2;
  int iVar3;
  CURLcode CVar4;
  ushort **ppuVar5;
  byte *chlg;
  undefined7 in_register_00000031;
  
  pSVar2 = conn->data;
  iVar3 = Curl_raw_nequal("Digest",header,6);
  if (iVar3 == 0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  for (chlg = (byte *)(header + 6); bVar1 = *chlg, (ulong)bVar1 != 0; chlg = chlg + 1) {
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) break;
  }
  CVar4 = Curl_sasl_decode_digest_http_message
                    ((char *)chlg,
                     (digestdata *)
                     ((long)&(pSVar2->state).digest.nonce +
                     (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 6)));
  return CVar4;
}

Assistant:

CURLcode Curl_input_digest(struct connectdata *conn,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  struct SessionHandle *data = conn->data;

  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_sasl_decode_digest_http_message(header, digest);
}